

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

char * getResult(char *func,list *tokens,list *output)

{
  OPCODE OVar1;
  list *plVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  list *plVar6;
  char *str;
  token *ptVar7;
  char *__s;
  long lVar8;
  int iVar9;
  list **list;
  token *ptVar10;
  double dVar11;
  double dVar12;
  double local_80;
  list *local_78;
  list *local_70;
  list *local_68;
  list *local_60;
  char *local_58;
  list *operators;
  double local_48;
  
  pcVar5 = (char *)malloc_(0x20);
  iVar9 = 0;
  inside_def = false;
  parenthesis_warning = false;
  initList(&operators);
  tokenize(tokens,func);
  plVar2 = operators;
  plVar6 = tokens;
  while (ptVar10 = plVar6->first, ptVar10 != (token *)0x0) {
    if (ptVar10->opcode == OP_Closed_parenthesis) {
      iVar9 = iVar9 + -1;
    }
    else if (ptVar10->opcode == OP_Open_parenthesis) {
      iVar9 = iVar9 + 1;
    }
    plVar6 = (list *)&ptVar10->next;
  }
  parenthesis_warning = iVar9 != 0;
  local_70 = operators;
  ptVar10 = tokens->first;
  division_warning = false;
  trigonometric_warning = false;
  local_68 = output;
  local_58 = pcVar5;
  while ((ptVar10 != (token *)0x0 && ((parenthesis_warning & 1U) == 0))) {
    OVar1 = ptVar10->opcode;
    if (OVar1 == OP_Open_parenthesis) {
LAB_00104361:
      list = &local_70;
LAB_00104366:
      push(list,ptVar10);
    }
    else {
      if (OVar1 != OP_Closed_parenthesis) {
        _Var3 = isFunction(OVar1);
        if (_Var3) goto LAB_00104361;
        _Var3 = isOperator(ptVar10->opcode);
        if (_Var3) {
          while (ptVar7 = plVar2->last, ptVar7 != (token *)0x0) {
            iVar9 = getPrec(ptVar10->opcode);
            iVar4 = getPrec(ptVar7->opcode);
            if (iVar9 < iVar4) break;
            moveToken(&local_68,&local_70);
          }
          push(&local_70,ptVar10);
          goto LAB_0010436e;
        }
        list = &local_68;
        goto LAB_00104366;
      }
      local_78 = plVar2;
      local_60 = output;
      while (ptVar7 = plVar2->last, ptVar7 != (token *)0x0) {
        pcVar5 = ptVar7->value;
        if ((*pcVar5 == '(') && (pcVar5[1] == '\0')) {
          if (plVar2->first == ptVar7) {
            plVar2->first = (token *)0x0;
          }
          plVar2->last = ptVar7->prev;
          free(pcVar5);
          free(ptVar7);
          break;
        }
        moveToken(&local_60,&local_78);
      }
    }
LAB_0010436e:
    ptVar10 = ptVar10->next;
  }
  while (plVar2->last != (token *)0x0) {
    moveToken(&local_68,&local_70);
  }
  ptVar10 = output->first;
  initList(&local_78);
  do {
    pcVar5 = local_58;
    if (ptVar10 == (token *)0x0) {
      dVar11 = 0.0;
      if ((local_78 != (list *)0x0) && (local_78->last != (token *)0x0)) {
        dVar11 = getValue(local_78->last->value);
      }
      if (-1 < (long)result_precision) {
        dVar11 = round_(dVar11,(long)result_precision);
      }
      freeList(local_78);
      snprintf(pcVar5,0x20,"%.15g",dVar11);
      freeList(operators);
      if (inside_def == true) {
        free(pcVar5);
        pcVar5 = (char *)0x0;
      }
      return pcVar5;
    }
    _Var3 = isOperator(ptVar10->opcode);
    if (((!_Var3) && (_Var3 = isFunction(ptVar10->opcode), !_Var3)) &&
       (_Var3 = isDataUnit(ptVar10->opcode), !_Var3)) {
      push(&local_78,ptVar10);
      goto LAB_00104558;
    }
    plVar2 = local_78;
    local_60 = local_78;
    if ((local_78 == (list *)0x0) || (local_78->last == (token *)0x0)) goto LAB_00104558;
    pcVar5 = pop(local_78);
    _Var3 = isFunction(ptVar10->opcode);
    if ((_Var3) || (_Var3 = isDataUnit(ptVar10->opcode), _Var3)) {
      str = (char *)0x0;
    }
    else {
      str = pop(plVar2);
    }
    OVar1 = ptVar10->opcode;
    inside_def = OVar1 == OP_Equal;
    if (inside_def) {
      dVar11 = getValue(pcVar5);
      addVariable(str,dVar11);
LAB_001044e0:
      local_80 = 0.0;
      goto LAB_001044e4;
    }
    local_80 = getValue(str);
    dVar11 = getValue(pcVar5);
    if (-1 < (long)precision) {
      local_48 = dVar11;
      local_80 = round_(local_80,(long)precision);
      dVar11 = round_(local_48,(long)precision);
    }
    if (OP_Pb < OVar1) {
switchD_001045db_caseD_4:
      if ((degree == true) &&
         (local_48 = dVar11, _Var3 = isTrigonometric(OVar1), dVar11 = local_48, _Var3)) {
        dVar11 = (local_48 / 180.0) * 3.141592653589793;
      }
      if (OVar1 == OP_Tan) {
        local_80 = tan(dVar11);
      }
      else if (OVar1 == OP_Cos) {
        local_80 = cos(dVar11);
      }
      else if (OVar1 == OP_Sin) {
        local_80 = sin(dVar11);
      }
      else {
        if ((OVar1 - OP_Asin < 3) && (1.0 < ABS(dVar11))) {
          trigonometric_warning = true;
          goto LAB_001044e0;
        }
        if (OVar1 == OP_Atan) {
          local_80 = atan(dVar11);
        }
        else if (OVar1 == OP_Acos) {
          local_80 = acos(dVar11);
        }
        else {
          local_80 = 0.0;
          if (OVar1 == OP_Asin) {
            local_80 = asin(dVar11);
          }
        }
      }
      goto LAB_001044e4;
    }
    dVar12 = dVar11 * 1024.0;
    switch(OVar1) {
    case OP_Plus:
      local_80 = local_80 + dVar11;
      break;
    case OP_Minus:
      local_80 = local_80 - dVar11;
      break;
    case OP_Multi:
      goto LAB_00104721;
    case OP_Div:
      if ((dVar11 == 0.0) && (!NAN(dVar11))) {
        division_warning = true;
        goto LAB_001044e0;
      }
      local_80 = local_80 / dVar11;
      break;
    case OP_Equal:
      goto switchD_001045db_caseD_4;
    case OP_Pow:
      local_80 = pow(local_80,dVar11);
      break;
    case OP_Fact:
      lVar8 = fact((long)(int)dVar11);
      local_80 = (double)lVar8;
      break;
    case OP_Sqrt:
      if (dVar11 < 0.0) {
        local_80 = sqrt(dVar11);
      }
      else {
        local_80 = SQRT(dVar11);
      }
      break;
    case OP_Abs:
      local_80 = ABS(dVar11);
      break;
    case OP_Log:
      local_80 = log(dVar11);
      break;
    case OP_Floor:
      local_80 = floor(dVar11);
      break;
    case OP_Ceil:
      local_80 = ceil(dVar11);
      break;
    case OP_Round:
      local_80 = round(dVar11);
      break;
    case OP_Rand:
      local_80 = getRand();
      break;
    case OP_Mb:
      local_80 = dVar11 * 1024.0;
      break;
    case OP_Gb:
      local_80 = dVar12 * 1024.0;
      break;
    case OP_Tb:
      goto LAB_0010471d;
    case OP_Pb:
      dVar12 = dVar12 * 1024.0;
LAB_0010471d:
      dVar11 = 1024.0;
      local_80 = dVar12 * 1024.0;
LAB_00104721:
      local_80 = local_80 * dVar11;
    }
LAB_001044e4:
    if (-1 < (long)precision) {
      local_80 = round_(local_80,(long)precision);
    }
    ptVar7 = (token *)malloc_(0x20);
    __s = (char *)malloc_(0x20);
    ptVar7->value = __s;
    snprintf(__s,0x20,"%.15g",local_80);
    push(&local_60,ptVar7);
    free(ptVar7->value);
    free(ptVar7);
    free(pcVar5);
    free(str);
LAB_00104558:
    ptVar10 = ptVar10->next;
  } while( true );
}

Assistant:

char *getResult(const char *func, struct list *tokens, struct list *output)
{
    struct list *operators;
    char *result = malloc_(BUFFER);
    inside_def = false;
    parenthesis_warning = false;

    initList(&operators);

    tokenize(tokens, func);
    validateParenthesis(tokens);
    infixToPostfix(tokens, output, operators);
    snprintf(result, BUFFER, NUMBER_FORMAT, getPostfixResult(output));
    freeList(operators);

    if (inside_def) {
        free(result);
        return NULL;
    }

    return result;
}